

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dialog_widgets.cpp
# Opt level: O2

void standard_cancel_method_proc(Am_Object *cmd)

{
  Am_Value *pAVar1;
  Am_Object local_30;
  Am_Object window;
  Am_Object widget;
  Am_Value local_18;
  
  pAVar1 = Am_Object::Get(cmd,0x170,0);
  Am_Object::Am_Object(&widget,pAVar1);
  pAVar1 = Am_Object::Get(&widget,0x68,0);
  Am_Object::Am_Object(&window,pAVar1);
  Am_Object::Am_Object(&local_30,&window);
  Am_Value::Am_Value(&local_18,&Am_No_Value);
  Am_Finish_Pop_Up_Waiting(&local_30,&local_18);
  Am_Value::~Am_Value(&local_18);
  Am_Object::~Am_Object(&local_30);
  Am_Object::~Am_Object(&window);
  Am_Object::~Am_Object(&widget);
  return;
}

Assistant:

Am_Define_Method(Am_Object_Method, void, standard_cancel_method,
                 (Am_Object cmd))
{
  Am_Object widget = cmd.Get(Am_SAVED_OLD_OWNER);
  Am_Object window = widget.Get(Am_WINDOW);
  Am_Finish_Pop_Up_Waiting(window, Am_No_Value);
}